

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

reg_desc_t * find_rd_by_reg(MIR_context_t ctx,MIR_reg_t reg,MIR_func_t func)

{
  reg_desc_t obj;
  int iVar1;
  MIR_error_func_t p_Var2;
  reg_desc_t *prVar3;
  reg_desc_t local_80;
  reg_desc_t local_68;
  undefined4 local_50;
  MIR_reg_t MStack_4c;
  reg_desc_t rd;
  size_t temp_rdn;
  size_t rdn;
  func_regs_t func_regs;
  MIR_func_t func_local;
  MIR_context_t pMStack_10;
  MIR_reg_t reg_local;
  MIR_context_t ctx_local;
  
  rdn = (size_t)func->internal;
  rd.type = MIR_T_I8;
  rd.reg = 0;
  local_50 = 6;
  MStack_4c = reg;
  func_regs = (func_regs_t)func;
  func_local._4_4_ = reg;
  pMStack_10 = ctx;
  rd.hard_reg_name = (char *)VARR_reg_desc_tlength(*(VARR_reg_desc_t **)rdn);
  obj.reg = MStack_4c;
  obj.type = local_50;
  obj.name = (char *)rd._0_8_;
  obj.hard_reg_name = rd.name;
  VARR_reg_desc_tpush(*(VARR_reg_desc_t **)rdn,obj);
  iVar1 = HTAB_size_t_do(*(HTAB_size_t **)(rdn + 0x18),(size_t)rd.hard_reg_name,HTAB_FIND,&temp_rdn)
  ;
  if (iVar1 == 0) {
    VARR_reg_desc_tpop(&local_68,*(VARR_reg_desc_t **)rdn);
    p_Var2 = MIR_get_error_func(pMStack_10);
    (*p_Var2)(MIR_undeclared_func_reg_error,"undeclared reg %u of func %s",(ulong)func_local._4_4_,
              func_regs->reg_descs);
  }
  VARR_reg_desc_tpop(&local_80,*(VARR_reg_desc_t **)rdn);
  prVar3 = VARR_reg_desc_taddr(*(VARR_reg_desc_t **)rdn);
  return prVar3 + temp_rdn;
}

Assistant:

static reg_desc_t *find_rd_by_reg (MIR_context_t ctx, MIR_reg_t reg, MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.reg = reg;
  rd.name = NULL;
  rd.type = MIR_T_I64; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->reg2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    MIR_get_error_func (ctx) (MIR_undeclared_func_reg_error, "undeclared reg %u of func %s", reg,
                              func->name);
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}